

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

double __thiscall slang::SVInt::toDouble(SVInt *this)

{
  double dVar1;
  SVInt *in_stack_00000088;
  SVInt *in_stack_ffffffffffffffd0;
  SVInt *in_stack_ffffffffffffffe0;
  SVInt local_18;
  
  SVInt(in_stack_ffffffffffffffd0,&local_18);
  dVar1 = toIEEE754<double,11,52,1023>(in_stack_00000088);
  ~SVInt(in_stack_ffffffffffffffe0);
  return dVar1;
}

Assistant:

double SVInt::toDouble() const {
    return toIEEE754<double, 11, 52, 1023>(*this);
}